

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void is_seq<float>(float *array,int stride,long count,long expected_start)

{
  ulong uVar1;
  ulong uVar2;
  char *message;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  int local_74;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  uVar1 = 0;
  uVar4 = 0;
  if (0 < stride) {
    uVar4 = (ulong)(uint)stride;
  }
  if (count < 1) {
    count = uVar1;
  }
  uVar2 = 0;
  local_74 = stride;
  do {
    if (uVar2 == count) {
      return;
    }
    uVar3 = uVar1;
    uVar5 = uVar4;
    while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
      local_80.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (uVar2 + expected_start);
      testing::internal::CmpHelperEQ<float,long>
                ((internal *)&gtest_ar,"array[output_index + j]","expected_start + i",array + uVar3,
                 (long *)&local_80);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                   ,0x290,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_80);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      uVar3 = (ulong)((int)uVar3 + 1);
    }
    uVar1 = (ulong)(uint)((int)uVar1 + local_74);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void is_seq(T * array, int stride, long count, long expected_start)
{
  uint32_t output_index = 0;
  for (long i = 0; i < count; i++) {
    for (int j = 0; j < stride; j++) {
      ASSERT_EQ(array[output_index + j], expected_start + i);
    }
    output_index += stride;
  }
}